

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

shared_ptr<vmips::VirtReg> __thiscall
vmips::CFGNode::append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>>
          (CFGNode *this,shared_ptr<vmips::VirtReg> *args,shared_ptr<vmips::VirtReg> *args_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::VirtReg> sVar1;
  shared_ptr<vmips::add> instr;
  __shared_ptr<vmips::add,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  vmips::VirtReg::create();
  std::
  make_shared<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>>
            ((shared_ptr<vmips::VirtReg> *)&local_40,(shared_ptr<vmips::VirtReg> *)this,args_1);
  std::__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<vmips::add,void>
            (local_30,&local_40);
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(args + 3),(shared_ptr<vmips::Instruction> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar1.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> append(Args &&...args) {
            auto ret = VirtReg::create();
            auto instr = std::make_shared<Instr>(ret, std::forward<Args>(args)...);
            instructions.push_back(instr);
            return ret;
        }